

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

void __thiscall Js::AsmJsVarType::AsmJsVarType(AsmJsVarType *this,AsmJSCoercion coercion)

{
  AsmJSCoercion coercion_local;
  AsmJsVarType *this_local;
  
  switch(coercion) {
  case AsmJS_ToInt32:
    this->which_ = Int;
    break;
  case AsmJS_ToNumber:
    this->which_ = Double;
    break;
  case AsmJS_FRound:
    this->which_ = Float;
    break;
  case AsmJS_Int32x4:
    this->which_ = Int32x4;
    break;
  case AsmJS_Bool32x4:
    this->which_ = Bool32x4;
    break;
  case AsmJS_Bool16x8:
    this->which_ = Bool16x8;
    break;
  case AsmJS_Bool8x16:
    this->which_ = Bool8x16;
    break;
  case AsmJS_Float32x4:
    this->which_ = Float32x4;
    break;
  case AsmJS_Float64x2:
    this->which_ = Float64x2;
    break;
  case AsmJS_Int16x8:
    this->which_ = Int16x8;
    break;
  case AsmJS_Int8x16:
    this->which_ = Int8x16;
    break;
  case AsmJS_Uint32x4:
    this->which_ = Uint32x4;
    break;
  case AsmJS_Uint16x8:
    this->which_ = Uint16x8;
    break;
  case AsmJS_Uint8x16:
    this->which_ = Uint8x16;
  }
  return;
}

Assistant:

AsmJsVarType::AsmJsVarType(AsmJSCoercion coercion)
    {
        switch (coercion)
        {
        case AsmJS_ToInt32: which_ = Int; break;
        case AsmJS_ToNumber: which_ = Double; break;
        case AsmJS_FRound: which_ = Float; break;
        case AsmJS_Int32x4: which_ = Int32x4; break;
        case AsmJS_Bool32x4: which_ = Bool32x4; break;
        case AsmJS_Bool16x8: which_ = Bool16x8; break;
        case AsmJS_Bool8x16: which_ = Bool8x16; break;
        case AsmJS_Float32x4: which_ = Float32x4; break;
        case AsmJS_Float64x2: which_ = Float64x2; break;
        case AsmJS_Int16x8: which_ = Int16x8; break;
        case AsmJS_Int8x16: which_ = Int8x16; break;
        case AsmJS_Uint32x4: which_ = Uint32x4; break;
        case AsmJS_Uint16x8: which_ = Uint16x8; break;
        case AsmJS_Uint8x16: which_ = Uint8x16; break;
        }
    }